

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O1

void __thiscall CardProdDiff::test_method(CardProdDiff *this)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  bool bVar3;
  Index outer_stride;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  char *pcVar6;
  VectorXd v;
  VectorXd x;
  MatrixXd J;
  MatrixXd Jtest;
  CartesianProduct S;
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace R2;
  RealSpace R3;
  undefined1 local_5e8 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_5d8;
  void *local_5d0;
  double *local_5c8;
  long lStack_5c0;
  shared_count local_5b8;
  void *local_5b0;
  undefined8 uStack_5a8;
  Matrix<double,__1,__1,_0,__1,__1> local_598;
  Scalar local_580;
  Matrix<double,__1,__1,_0,__1,__1> local_578;
  char *local_560;
  char *local_558;
  Scalar local_550;
  Matrix<double,__1,__1,_0,__1,__1> *local_548;
  void *pvStack_540;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  Scalar local_408;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  Scalar local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  Scalar local_3b8;
  Scalar local_3b0;
  undefined1 local_3a8 [24];
  char **local_390;
  undefined8 uStack_388;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  code *local_248 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_1f0 [24];
  void *local_1d8;
  void *local_1c0;
  SO3<mnf::ExpMapMatrix> local_1a8;
  code *local_108 [11];
  void *local_b0;
  void *local_a0;
  code *local_90 [11];
  void *local_38;
  void *local_28;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_108,2);
  mnf::RealSpace::RealSpace((RealSpace *)local_90,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1a8);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_248,(Manifold *)local_108,&local_1a8.super_Manifold);
  local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(0x37);
  local_3a8._0_8_ = &local_578;
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0xb;
  local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 5;
  local_3a8._8_8_ = (void *)0x0;
  local_3a8._16_8_ = 1;
  local_390 = (char **)0x1;
  *local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = 1.0
  ;
  local_5c8 = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a8,
                      (Scalar *)&local_5c8);
  local_5d8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_5d8);
  local_5e8._0_8_ = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)local_5e8);
  local_560 = (char *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_560);
  local_580 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_580);
  local_550 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_550);
  local_3b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3b0);
  local_3b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3b8);
  local_3c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3c0);
  local_3c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3c8);
  local_3d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3d0);
  local_3d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3d8);
  local_3e0 = -0.573417053935868;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3e0);
  local_3e8 = -0.109861317404411;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3e8);
  local_3f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3f0);
  local_3f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_3f8);
  local_400 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_400);
  local_408 = 0.249497069246539;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_408);
  local_410 = 0.920480138494529;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_410);
  local_418 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_418);
  local_420 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_420);
  local_428 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_428);
  local_430 = -0.780348700705586;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_430);
  local_438 = 0.375029072973363;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_438);
  local_440 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_440);
  local_448 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_448);
  local_450 = 0.573417053935868;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_450);
  local_458 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_458);
  local_460 = -0.811864134688605;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_460);
  local_468 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_468);
  local_470 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_470);
  local_478 = -0.249497069246539;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_478);
  local_480 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_480);
  local_488 = -0.300778202459022;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_488);
  local_490 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_490);
  local_498 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_498);
  local_4a0 = 0.780348700705586;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a0);
  local_4a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a8);
  local_4b0 = 0.500408932506048;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b0);
  local_4b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b8);
  local_4c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c0);
  local_4c8 = 0.109861317404411;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c8);
  local_4d0 = 0.811864134688605;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d0);
  local_4d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d8);
  local_4e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e0);
  local_4e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e8);
  local_4f0 = -0.920480138494529;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f0);
  local_4f8 = 0.300778202459022;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f8);
  local_500 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_500);
  local_508 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_508);
  local_510 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_510);
  local_518 = -0.375029072973363;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_518);
  local_520 = -0.500408932506048;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_520);
  local_528 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_528);
  if ((((long)local_390 + local_3a8._8_8_ ==
        (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a8._0_8_)->m_storage)
        .m_rows) ||
      ((((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a8._0_8_)->m_storage).
       m_cols == 0)) &&
     (local_3a8._16_8_ ==
      (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a8._0_8_)->m_storage).
      m_cols)) {
    mnf::Manifold::getZero();
    mnf::SubPoint::value();
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5d8,
               (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_5c8);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_390);
    free((void *)local_3a8._8_8_);
    local_5e8._0_8_ = (double *)0x0;
    local_5e8._8_8_ = 0;
    free((void *)0x0);
    local_5e8._0_8_ = Eigen::internal::conditional_aligned_new_auto<double,true>(5);
    local_5e8._8_8_ = 5;
    local_3a8._8_8_ = (void *)0x0;
    local_3a8._16_8_ = 1;
    local_390 = (char **)0x1;
    *(double *)local_5e8._0_8_ = 243.27432598;
    local_5c8 = (double *)0xc141a82b9e65bea1;
    local_3a8._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_5e8;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,
                        (Scalar *)&local_5c8);
    local_560 = (char *)0x3fd5c8e11a61ab16;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,(Scalar *)&local_560);
    local_580 = 0.58526775;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_580);
    local_550 = 0.223811;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_550);
    if (((long)local_390 + local_3a8._8_8_ ==
         (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3a8._0_8_)->m_storage
         ).m_rows) && (local_3a8._16_8_ == 1)) {
      local_548 = local_5d8;
      pvStack_540 = local_5d0;
      if ((long)local_5d0 < 0 && local_5d8 != (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
        pcVar6 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
        ;
      }
      else {
        local_390 = (char **)0x0;
        uStack_388 = 0;
        local_3a8._0_8_ = local_5d8;
        local_3a8._8_8_ = local_5d0;
        local_5b0 = (void *)0x0;
        uStack_5a8 = 0;
        local_5c8 = (double *)local_5e8._0_8_;
        lStack_5c0 = local_5e8._8_8_;
        if (-1 < (long)local_5e8._8_8_ || (double *)local_5e8._0_8_ == (double *)0x0) {
          mnf::Manifold::retractation(local_248,&local_548,local_3a8,&local_5c8);
          free(local_5b0);
          free(local_390);
          local_390 = (char **)0x0;
          uStack_388 = 0;
          local_3a8._0_8_ = local_5d8;
          local_3a8._8_8_ = local_5d0;
          if (-1 < (long)local_5d0 || local_5d8 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            mnf::Manifold::diffRetractation((Ref_conflict *)&local_5c8);
            IVar2 = local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols;
            IVar1 = local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
            __ptr = local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
            local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = local_5c8;
            local_5c8 = __ptr;
            local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = lStack_5c0;
            local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = (Index)local_5b8.pi_;
            lStack_5c0 = IVar1;
            local_5b8.pi_ = (sp_counted_base *)IVar2;
            free(__ptr);
            free(local_390);
            local_258 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
            ;
            local_250 = "";
            local_268 = &boost::unit_test::basic_cstring<char_const>::null;
            local_260 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x157);
            local_580 = 1e-12;
            bVar3 = Eigen::internal::
                    isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                    ::run(&local_598,&local_578,&local_580);
            local_5c8 = (double *)CONCAT71(local_5c8._1_7_,bVar3);
            lStack_5c0 = 0;
            local_5b8.pi_ = (sp_counted_base *)0x0;
            local_560 = "J.isApprox(Jtest)";
            local_558 = "";
            local_3a8._8_8_ = local_3a8._8_8_ & 0xffffffffffffff00;
            local_3a8._0_8_ = &PTR__lazy_ostream_00144b88;
            local_3a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
            local_278 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
            ;
            local_270 = "";
            local_390 = &local_560;
            boost::test_tools::tt_detail::report_assertion();
            boost::detail::shared_count::~shared_count(&local_5b8);
            free((void *)local_5e8._0_8_);
            free(local_5d8);
            free(local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            free(local_598.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            local_248[0] = free;
            if (local_1c0 != (void *)0x0) {
              operator_delete(local_1c0);
            }
            if (local_1d8 != (void *)0x0) {
              operator_delete(local_1d8);
            }
            std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::~vector(local_1f0);
            mnf::Manifold::~Manifold((Manifold *)local_248);
            local_1a8._0_8_ = &PTR__SO3_00144670;
            mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                      ((ReusableTemporaryMap *)((long)&local_1a8 + 0x58));
            mnf::Manifold::~Manifold(&local_1a8.super_Manifold);
            local_90[0] = std::terminate;
            free(local_28);
            free(local_38);
            mnf::Manifold::~Manifold((Manifold *)local_90);
            local_108[0] = std::terminate;
            free(local_a0);
            free(local_b0);
            mnf::Manifold::~Manifold((Manifold *)local_108);
            return;
          }
        }
        uStack_388 = 0;
        local_390 = (char **)0x0;
        pcVar6 = 
        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
        ;
        local_3a8._0_8_ = local_5d8;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar6);
    }
    pcVar6 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    pcVar6 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar6);
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdDiff)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S(R2, RotSpace);
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(11, 5);
  Jtest << 1, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, -0.573417053935868,
      -0.109861317404411, 0, 0, 0, 0.249497069246539, 0.920480138494529, 0, 0,
      0, -0.780348700705586, 0.375029072973363, 0, 0, 0.573417053935868, 0,
      -0.811864134688605, 0, 0, -0.249497069246539, 0, -0.300778202459022, 0, 0,
      0.780348700705586, 0, 0.500408932506048, 0, 0, 0.109861317404411,
      0.811864134688605, 0, 0, 0, -0.920480138494529, 0.300778202459022, 0, 0,
      0, -0.375029072973363, -0.500408932506048, 0;
  Eigen::VectorXd x = S.getZero().value();
  Eigen::VectorXd v(5);
  v << 243.27432598, -2314327.23748, 0.3403857, 0.58526775, 0.223811;
  S.retractation(x, x, v);
  J = S.diffRetractation(x);
  BOOST_CHECK(J.isApprox(Jtest));
}